

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedNames.cpp
# Opt level: O2

void __thiscall wasm::RemoveUnusedNames::visitLoop(RemoveUnusedNames *this,Loop *curr)

{
  handleBreakTarget(this,&curr->name);
  if (((curr->name).super_IString.str._M_str == (char *)0x0) &&
     ((curr->body->type).id ==
      (curr->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id)) {
    Walker<wasm::RemoveUnusedNames,_wasm::UnifiedExpressionVisitor<wasm::RemoveUnusedNames,_void>_>
    ::replaceCurrent(&(this->
                      super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedNames,_wasm::UnifiedExpressionVisitor<wasm::RemoveUnusedNames,_void>_>_>
                      ).
                      super_PostWalker<wasm::RemoveUnusedNames,_wasm::UnifiedExpressionVisitor<wasm::RemoveUnusedNames,_void>_>
                      .
                      super_Walker<wasm::RemoveUnusedNames,_wasm::UnifiedExpressionVisitor<wasm::RemoveUnusedNames,_void>_>
                     ,curr->body);
    return;
  }
  return;
}

Assistant:

void visitLoop(Loop* curr) {
    handleBreakTarget(curr->name);
    if (!curr->name.is() && curr->body->type == curr->type) {
      replaceCurrent(curr->body);
    }
  }